

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O1

BUFFER_HANDLE mqtt_codec_disconnect(void)

{
  int iVar1;
  BUFFER_HANDLE handle;
  uchar *puVar2;
  
  handle = BUFFER_new();
  if (handle != (BUFFER_HANDLE)0x0) {
    iVar1 = BUFFER_enlarge(handle,2);
    if ((iVar1 == 0) && (puVar2 = BUFFER_u_char(handle), puVar2 != (uchar *)0x0)) {
      puVar2[0] = 0xe0;
      puVar2[1] = '\0';
      return handle;
    }
    BUFFER_delete(handle);
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE mqtt_codec_disconnect()
{
    /* Codes_SRS_MQTT_CODEC_07_011: [On success mqtt_codec_disconnect shall construct a BUFFER_HANDLE that represents a MQTT DISCONNECT packet.] */
    BUFFER_HANDLE result = BUFFER_new();
    if (result != NULL)
    {
        if (BUFFER_enlarge(result, 2) != 0)
        {
            /* Codes_SRS_MQTT_CODEC_07_012: [If any error is encountered mqtt_codec_disconnect shall return NULL.] */
            BUFFER_delete(result);
            result = NULL;
        }
        else
        {
            uint8_t* iterator = BUFFER_u_char(result);
            if (iterator == NULL)
            {
                /* Codes_SRS_MQTT_CODEC_07_012: [If any error is encountered mqtt_codec_disconnect shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                iterator[0] = DISCONNECT_TYPE;
                iterator[1] = 0;
            }
        }
    }
    return result;
}